

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::EndFrame(void)

{
  float fVar1;
  int iVar2;
  uint uVar3;
  _func_void_int_int *p_Var4;
  ImGuiWindow **ppIVar5;
  ImGuiWindow *pIVar6;
  ImVec2 IVar7;
  ImGuiContext *pIVar8;
  ImGuiContext *pIVar9;
  ImGuiWindow **ppIVar10;
  ulong uVar11;
  ImGuiWindow *pIVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  bool bVar16;
  float fVar17;
  float fVar18;
  
  pIVar8 = GImGui;
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0xff1,"void ImGui::EndFrame()");
  }
  if (GImGui->FrameCountEnded != GImGui->FrameCount) {
    p_Var4 = (GImGui->IO).ImeSetInputScreenPosFn;
    if (p_Var4 != (_func_void_int_int *)0x0) {
      fVar1 = (GImGui->PlatformImePos).x;
      fVar17 = (GImGui->PlatformImeLastPos).x - fVar1;
      fVar18 = (GImGui->PlatformImeLastPos).y - (GImGui->PlatformImePos).y;
      if (0.0001 < fVar17 * fVar17 + fVar18 * fVar18) {
        (*p_Var4)((int)fVar1,(int)(GImGui->PlatformImePos).y);
        pIVar8->PlatformImeLastPos = pIVar8->PlatformImePos;
      }
    }
    if ((pIVar8->CurrentWindowStack).Size != 1) {
      __assert_fail("g.CurrentWindowStack.Size == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0xffd,"void ImGui::EndFrame()");
    }
    pIVar12 = pIVar8->CurrentWindow;
    if ((pIVar12 != (ImGuiWindow *)0x0) && (pIVar12->WriteAccessed == false)) {
      pIVar12->Active = false;
    }
    End();
    if (((pIVar8->ActiveId == 0) && (pIVar8->HoveredId == 0)) &&
       ((pIVar12 = pIVar8->NavWindow, pIVar12 == (ImGuiWindow *)0x0 || (pIVar12->Appearing == false)
        ))) {
      if ((pIVar8->IO).MouseClicked[0] == true) {
        if (pIVar8->HoveredRootWindow == (ImGuiWindow *)0x0) {
          if (pIVar12 != (ImGuiWindow *)0x0) {
            pIVar12 = GetFrontMostPopupModal();
            pIVar9 = GImGui;
            if ((pIVar12 == (ImGuiWindow *)0x0) && (GImGui->NavWindow != (ImGuiWindow *)0x0)) {
              GImGui->NavWindow = (ImGuiWindow *)0x0;
              pIVar9->NavInitRequest = false;
              pIVar9->NavId = 0;
              pIVar9->NavIdIsAlive = false;
              pIVar9->NavLayer = 0;
            }
          }
        }
        else {
          FocusWindow(pIVar8->HoveredWindow);
          SetActiveID(pIVar8->HoveredWindow->MoveId,pIVar8->HoveredWindow);
          pIVar8->NavDisableHighlight = true;
          pIVar12 = pIVar8->HoveredRootWindow;
          IVar7.y = (pIVar8->IO).MousePos.y - (pIVar12->Pos).y;
          IVar7.x = (pIVar8->IO).MousePos.x - (pIVar12->Pos).x;
          pIVar8->ActiveIdClickOffset = IVar7;
          if (((pIVar8->HoveredWindow->Flags & 4) == 0) && ((pIVar12->Flags & 4) == 0)) {
            pIVar8->MovingWindow = pIVar8->HoveredWindow;
          }
        }
      }
      if ((pIVar8->IO).MouseClicked[1] == true) {
        pIVar12 = GetFrontMostPopupModal();
        bVar16 = pIVar12 == (ImGuiWindow *)0x0;
        lVar14 = (long)(pIVar8->Windows).Size;
        do {
          if ((lVar14 < 1) || (bVar16)) break;
          pIVar6 = (pIVar8->Windows).Data[lVar14 + -1];
          if (pIVar6 != pIVar12) {
            if (pIVar6 == pIVar8->HoveredWindow) {
              bVar16 = true;
            }
          }
          lVar14 = lVar14 + -1;
        } while (pIVar6 != pIVar12);
        if (bVar16) {
          pIVar12 = pIVar8->HoveredWindow;
        }
        ClosePopupsOverWindow(pIVar12);
      }
    }
    iVar2 = (pIVar8->WindowsSortBuffer).Capacity;
    if (iVar2 < 0) {
      uVar13 = iVar2 / 2 + iVar2;
      uVar11 = 0;
      if (0 < (int)uVar13) {
        uVar11 = (ulong)uVar13;
      }
      GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
      ppIVar10 = (ImGuiWindow **)(*GImAllocatorAllocFunc)(uVar11 * 8,GImAllocatorUserData);
      ppIVar5 = (pIVar8->WindowsSortBuffer).Data;
      if (ppIVar5 != (ImGuiWindow **)0x0) {
        memcpy(ppIVar10,ppIVar5,(long)(pIVar8->WindowsSortBuffer).Size << 3);
        ppIVar5 = (pIVar8->WindowsSortBuffer).Data;
        if (ppIVar5 != (ImGuiWindow **)0x0) {
          GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
        }
        (*GImAllocatorFreeFunc)(ppIVar5,GImAllocatorUserData);
      }
      (pIVar8->WindowsSortBuffer).Data = ppIVar10;
      (pIVar8->WindowsSortBuffer).Capacity = (int)uVar11;
    }
    (pIVar8->WindowsSortBuffer).Size = 0;
    iVar2 = (pIVar8->Windows).Size;
    if ((pIVar8->WindowsSortBuffer).Capacity < iVar2) {
      GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
      ppIVar10 = (ImGuiWindow **)(*GImAllocatorAllocFunc)((long)iVar2 << 3,GImAllocatorUserData);
      ppIVar5 = (pIVar8->WindowsSortBuffer).Data;
      if (ppIVar5 != (ImGuiWindow **)0x0) {
        memcpy(ppIVar10,ppIVar5,(long)(pIVar8->WindowsSortBuffer).Size << 3);
        ppIVar5 = (pIVar8->WindowsSortBuffer).Data;
        if (ppIVar5 != (ImGuiWindow **)0x0) {
          GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
        }
        (*GImAllocatorFreeFunc)(ppIVar5,GImAllocatorUserData);
      }
      (pIVar8->WindowsSortBuffer).Data = ppIVar10;
      (pIVar8->WindowsSortBuffer).Capacity = iVar2;
    }
    uVar13 = (pIVar8->Windows).Size;
    uVar11 = (ulong)uVar13;
    if (uVar13 != 0) {
      uVar15 = 0;
      do {
        if ((long)(int)uVar11 <= (long)uVar15) {
          __assert_fail("i < Size",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.h"
                        ,0x4c0,
                        "value_type &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]");
        }
        pIVar12 = (pIVar8->Windows).Data[uVar15];
        if ((pIVar12->Active != true) || ((pIVar12->Flags & 0x1000000) == 0)) {
          AddWindowToSortedBuffer(&pIVar8->WindowsSortBuffer,pIVar12);
        }
        uVar15 = uVar15 + 1;
        uVar13 = (pIVar8->Windows).Size;
        uVar11 = (ulong)uVar13;
      } while (uVar15 != uVar11);
    }
    uVar3 = (pIVar8->WindowsSortBuffer).Size;
    if (uVar13 != uVar3) {
      __assert_fail("g.Windows.Size == g.WindowsSortBuffer.Size",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0x103d,"void ImGui::EndFrame()");
    }
    (pIVar8->WindowsSortBuffer).Size = uVar13;
    (pIVar8->Windows).Size = uVar3;
    iVar2 = (pIVar8->WindowsSortBuffer).Capacity;
    (pIVar8->WindowsSortBuffer).Capacity = (pIVar8->Windows).Capacity;
    (pIVar8->Windows).Capacity = iVar2;
    ppIVar5 = (pIVar8->WindowsSortBuffer).Data;
    (pIVar8->WindowsSortBuffer).Data = (pIVar8->Windows).Data;
    (pIVar8->Windows).Data = ppIVar5;
    (pIVar8->IO).MouseWheel = 0.0;
    (pIVar8->IO).MouseWheelH = 0.0;
    (pIVar8->IO).InputCharacters[0] = 0;
    (pIVar8->IO).InputCharacters[1] = 0;
    (pIVar8->IO).InputCharacters[2] = 0;
    (pIVar8->IO).InputCharacters[3] = 0;
    (pIVar8->IO).InputCharacters[4] = 0;
    (pIVar8->IO).InputCharacters[5] = 0;
    (pIVar8->IO).InputCharacters[6] = 0;
    (pIVar8->IO).InputCharacters[7] = 0;
    (pIVar8->IO).InputCharacters[8] = 0;
    (pIVar8->IO).InputCharacters[9] = 0;
    (pIVar8->IO).InputCharacters[10] = 0;
    (pIVar8->IO).InputCharacters[0xb] = 0;
    (pIVar8->IO).InputCharacters[0xc] = 0;
    (pIVar8->IO).InputCharacters[0xd] = 0;
    (pIVar8->IO).InputCharacters[0xe] = 0;
    (pIVar8->IO).InputCharacters[0xf] = 0;
    *(undefined8 *)((pIVar8->IO).InputCharacters + 0x10) = 0;
    *(undefined8 *)((long)(pIVar8->IO).NavInputs + 6) = 0;
    *(undefined8 *)((long)(pIVar8->IO).NavInputs + 0xe) = 0;
    *(undefined8 *)((long)(pIVar8->IO).NavInputs + 0x16) = 0;
    *(undefined8 *)((long)(pIVar8->IO).NavInputs + 0x1e) = 0;
    *(undefined8 *)((long)(pIVar8->IO).NavInputs + 0x26) = 0;
    *(undefined8 *)((long)(pIVar8->IO).NavInputs + 0x2e) = 0;
    *(undefined8 *)((long)(pIVar8->IO).NavInputs + 0x36) = 0;
    *(undefined8 *)((long)(pIVar8->IO).NavInputs + 0x3e) = 0;
    *(undefined8 *)((long)(pIVar8->IO).NavInputs + 0x46) = 0;
    (pIVar8->IO).NavInputs[0x13] = 0.0;
    (pIVar8->IO).NavInputs[0x14] = 0.0;
    pIVar8->FrameCountEnded = pIVar8->FrameCount;
  }
  return;
}

Assistant:

void ImGui::EndFrame()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);                       // Forgot to call ImGui::NewFrame()
    if (g.FrameCountEnded == g.FrameCount)          // Don't process EndFrame() multiple times.
        return;

    // Notify OS when our Input Method Editor cursor has moved (e.g. CJK inputs using Microsoft IME)
    if (g.IO.ImeSetInputScreenPosFn && ImLengthSqr(g.PlatformImeLastPos - g.PlatformImePos) > 0.0001f)
    {
        g.IO.ImeSetInputScreenPosFn((int)g.PlatformImePos.x, (int)g.PlatformImePos.y);
        g.PlatformImeLastPos = g.PlatformImePos;
    }

    // Hide implicit "Debug" window if it hasn't been used
    IM_ASSERT(g.CurrentWindowStack.Size == 1);    // Mismatched Begin()/End() calls, did you forget to call end on g.CurrentWindow->Name?
    if (g.CurrentWindow && !g.CurrentWindow->WriteAccessed)
        g.CurrentWindow->Active = false;
    End();

    if (g.ActiveId == 0 && g.HoveredId == 0)
    {
        if (!g.NavWindow || !g.NavWindow->Appearing) // Unless we just made a window/popup appear
        {
            // Click to focus window and start moving (after we're done with all our widgets)
            if (g.IO.MouseClicked[0])
            {
                if (g.HoveredRootWindow != NULL)
                {
                    // Set ActiveId even if the _NoMove flag is set, without it dragging away from a window with _NoMove would activate hover on other windows.
                    FocusWindow(g.HoveredWindow);
                    SetActiveID(g.HoveredWindow->MoveId, g.HoveredWindow);
                    g.NavDisableHighlight = true;
                    g.ActiveIdClickOffset = g.IO.MousePos - g.HoveredRootWindow->Pos;
                    if (!(g.HoveredWindow->Flags & ImGuiWindowFlags_NoMove) && !(g.HoveredRootWindow->Flags & ImGuiWindowFlags_NoMove))
                        g.MovingWindow = g.HoveredWindow;
                }
                else if (g.NavWindow != NULL && GetFrontMostPopupModal() == NULL)
                {
                    // Clicking on void disable focus
                    FocusWindow(NULL);
                }
            }

            // With right mouse button we close popups without changing focus
            // (The left mouse button path calls FocusWindow which will lead NewFrame->ClosePopupsOverWindow to trigger)
            if (g.IO.MouseClicked[1])
            {
                // Find the top-most window between HoveredWindow and the front most Modal Window.
                // This is where we can trim the popup stack.
                ImGuiWindow* modal = GetFrontMostPopupModal();
                bool hovered_window_above_modal = false;
                if (modal == NULL)
                    hovered_window_above_modal = true;
                for (int i = g.Windows.Size - 1; i >= 0 && hovered_window_above_modal == false; i--)
                {
                    ImGuiWindow* window = g.Windows[i];
                    if (window == modal)
                        break;
                    if (window == g.HoveredWindow)
                        hovered_window_above_modal = true;
                }
                ClosePopupsOverWindow(hovered_window_above_modal ? g.HoveredWindow : modal);
            }
        }
    }

    // Sort the window list so that all child windows are after their parent
    // We cannot do that on FocusWindow() because childs may not exist yet
    g.WindowsSortBuffer.resize(0);
    g.WindowsSortBuffer.reserve(g.Windows.Size);
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Active && (window->Flags & ImGuiWindowFlags_ChildWindow))       // if a child is active its parent will add it
            continue;
        AddWindowToSortedBuffer(&g.WindowsSortBuffer, window);
    }

    IM_ASSERT(g.Windows.Size == g.WindowsSortBuffer.Size);  // we done something wrong
    g.Windows.swap(g.WindowsSortBuffer);

    // Clear Input data for next frame
    g.IO.MouseWheel = g.IO.MouseWheelH = 0.0f;
    memset(g.IO.InputCharacters, 0, sizeof(g.IO.InputCharacters));
    memset(g.IO.NavInputs, 0, sizeof(g.IO.NavInputs));

    g.FrameCountEnded = g.FrameCount;
}